

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileStorage.cpp
# Opt level: O2

bool DynamicProfileStorage::CreateCacheCatalog(void)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  undefined4 *puVar4;
  int local_2c;
  undefined1 auStack_28 [8];
  DynamicProfileStorageReaderWriter catalogFile;
  
  if (!enabled) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,0x318,"(enabled)","enabled");
    if (!bVar2) goto LAB_00891d5e;
    *puVar4 = 0;
  }
  if (useCacheDir == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,0x319,"(useCacheDir)","useCacheDir");
    if (!bVar2) goto LAB_00891d5e;
    *puVar4 = 0;
  }
  if (locked == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,0x31a,"(locked)","locked");
    if (!bVar2) {
LAB_00891d5e:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  nextFileId = 0;
  creationTime = GetCreationTime();
  auStack_28 = (undefined1  [8])0x0;
  catalogFile.filename = (char16 *)0x0;
  bVar2 = DynamicProfileStorageReaderWriter::Init
                    ((DynamicProfileStorageReaderWriter *)auStack_28,catalogFilename,L"wb",true,
                     (errno_t *)0x0);
  if (bVar2) {
    bVar2 = DynamicProfileStorageReaderWriter::Write<unsigned_int>
                      ((DynamicProfileStorageReaderWriter *)auStack_28,&MagicNumber);
    if (bVar2) {
      bVar2 = DynamicProfileStorageReaderWriter::Write<unsigned_int>
                        ((DynamicProfileStorageReaderWriter *)auStack_28,&FileFormatVersion);
      if (bVar2) {
        bVar2 = DynamicProfileStorageReaderWriter::Write<long>
                          ((DynamicProfileStorageReaderWriter *)auStack_28,&creationTime);
        if (bVar2) {
          local_2c = 0;
          bVar2 = DynamicProfileStorageReaderWriter::Write<int>
                            ((DynamicProfileStorageReaderWriter *)auStack_28,&local_2c);
          if (bVar2) {
            lastOffset = DynamicProfileStorageReaderWriter::Size
                                   ((DynamicProfileStorageReaderWriter *)auStack_28);
            ClearInfoMap(true);
            DynamicProfileStorageReaderWriter::Close
                      ((DynamicProfileStorageReaderWriter *)auStack_28,false);
            bVar3 = DoTrace();
            bVar2 = true;
            if (bVar3) {
              Output::Print(L"TRACE: DynamicProfileStorage: Cache directory catalog created: \'%s\'\n"
                            ,catalogFilename);
              Output::Flush();
            }
            goto LAB_00891d4c;
          }
        }
      }
    }
  }
  DisableCacheDir();
  Output::Print(L"ERROR: DynamicProfileStorage: Unable to create cache catalog\n");
  Output::Flush();
  bVar2 = false;
LAB_00891d4c:
  DynamicProfileStorageReaderWriter::~DynamicProfileStorageReaderWriter
            ((DynamicProfileStorageReaderWriter *)auStack_28);
  return bVar2;
}

Assistant:

bool DynamicProfileStorage::CreateCacheCatalog()
{
    AssertOrFailFast(enabled);
    AssertOrFailFast(useCacheDir);
    AssertOrFailFast(locked);
    nextFileId = 0;
    creationTime = GetCreationTime();
    DynamicProfileStorageReaderWriter catalogFile;
    if (!catalogFile.Init(catalogFilename, _u("wb"), true)
        || !catalogFile.Write(MagicNumber)
        || !catalogFile.Write(FileFormatVersion)
        || !catalogFile.Write(creationTime)
        || !catalogFile.Write(0)) // count
    {
        DisableCacheDir();
        Output::Print(_u("ERROR: DynamicProfileStorage: Unable to create cache catalog\n"));
        Output::Flush();
        return false;
    }
    lastOffset = catalogFile.Size();
    ClearInfoMap(true);
    catalogFile.Close();

#if DBG_DUMP
    if (DynamicProfileStorage::DoTrace())
    {
        Output::Print(_u("TRACE: DynamicProfileStorage: Cache directory catalog created: '%s'\n"), catalogFilename);
        Output::Flush();
    }
#endif
    return true;
}